

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O1

void av1_write_intra_coeffs_mb(AV1_COMMON *cm,MACROBLOCK *x,aom_writer *w,BLOCK_SIZE bsize)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000009;
  int block_00;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint blk_row;
  uint blk_col;
  int iVar19;
  bool bVar20;
  int block [3];
  
  uVar1 = cm->seq_params->monochrome;
  block[2] = 0;
  block[0] = 0;
  block[1] = 0;
  uVar10 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  uVar11 = (uint)block_size_wide[uVar10];
  iVar13 = (x->e_mbd).mb_to_right_edge;
  if (iVar13 < 0) {
    uVar11 = (uint)block_size_wide[uVar10] +
             (iVar13 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
  }
  uVar11 = (int)uVar11 >> 2;
  uVar12 = (uint)block_size_high[uVar10];
  iVar13 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar13 < 0) {
    uVar12 = (uint)block_size_high[uVar10] +
             (iVar13 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
  }
  iVar13 = (int)uVar12 >> 2;
  uVar12 = 0x10;
  if ((int)uVar11 < 0x10) {
    uVar12 = uVar11;
  }
  iVar7 = 0x10;
  if (iVar13 < 0x10) {
    iVar7 = iVar13;
  }
  if (0 < iVar13) {
    uVar18 = 0;
    do {
      if (0 < (int)uVar11) {
        iVar8 = uVar18 + iVar7;
        if (iVar13 <= (int)(uVar18 + iVar7)) {
          iVar8 = iVar13;
        }
        uVar14 = 0;
        do {
          uVar15 = uVar12 + uVar14;
          uVar9 = uVar11;
          if ((int)uVar15 < (int)uVar11) {
            uVar9 = uVar15;
          }
          uVar10 = 0;
          while ((uVar10 == 0 || ((x->e_mbd).is_chroma_ref == true))) {
            pMVar6 = *(x->e_mbd).mi;
            if ((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) {
              if (uVar10 == 0) {
                uVar17 = (uint)pMVar6->tx_size;
              }
              else {
                bVar3 = ""[av1_ss_size_lookup[pMVar6->bsize][(x->e_mbd).plane[uVar10].subsampling_x]
                           [(x->e_mbd).plane[uVar10].subsampling_y]];
                if (bVar3 < 0x11) {
                  uVar17 = 3;
                  if ((1 < bVar3 - 0xb) && (bVar3 != 4)) {
LAB_001cb3fd:
                    uVar17 = (uint)bVar3;
                  }
                }
                else if (bVar3 == 0x11) {
                  uVar17 = 9;
                }
                else {
                  if (bVar3 != 0x12) goto LAB_001cb3fd;
                  uVar17 = 10;
                }
              }
            }
            else {
              uVar17 = 0;
            }
            bVar3 = (byte)(x->e_mbd).plane[uVar10].subsampling_y;
            bVar2 = (byte)(x->e_mbd).plane[uVar10].subsampling_x;
            iVar16 = ((1 << (bVar3 & 0x1f)) >> 1) + iVar8 >> (bVar3 & 0x1f);
            iVar19 = (int)(((1 << (bVar2 & 0x1f)) >> 1) + uVar9) >> (bVar2 & 0x1f);
            blk_row = uVar18 >> (bVar3 & 0x1f);
            if ((int)blk_row < iVar16) {
              iVar4 = *(int *)((long)tx_size_high_unit + (ulong)(uVar17 * 4));
              iVar5 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar17 * 4));
              do {
                blk_col = uVar14 >> ((byte)(x->e_mbd).plane[uVar10].subsampling_x & 0x1f);
                if ((int)blk_col < iVar19) {
                  block_00 = block[uVar10];
                  do {
                    av1_write_coeffs_txb
                              (cm,x,w,blk_row,blk_col,(int)uVar10,block_00,(TX_SIZE)uVar17);
                    block_00 = block_00 + iVar5 * iVar4;
                    blk_col = blk_col + iVar5;
                  } while ((int)blk_col < iVar19);
                  block[uVar10] = block_00;
                }
                blk_row = blk_row + iVar4;
              } while ((int)blk_row < iVar16);
            }
            if ((uVar1 != '\0') || (bVar20 = 1 < uVar10, uVar10 = uVar10 + 1, bVar20)) break;
          }
          uVar14 = uVar15;
        } while ((int)uVar15 < (int)uVar11);
      }
      uVar18 = uVar18 + iVar7;
    } while ((int)uVar18 < iVar13);
  }
  return;
}

Assistant:

void av1_write_intra_coeffs_mb(const AV1_COMMON *const cm, MACROBLOCK *x,
                               aom_writer *w, BLOCK_SIZE bsize) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int num_planes = av1_num_planes(cm);
  int block[MAX_MB_PLANE] = { 0 };
  int row, col;
  assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                       xd->plane[0].subsampling_y));
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
  int mu_blocks_wide = mi_size_wide[max_unit_bsize];
  int mu_blocks_high = mi_size_high[max_unit_bsize];
  mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
  mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

  for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
    for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
      for (int plane = 0; plane < num_planes; ++plane) {
        if (plane && !xd->is_chroma_ref) break;
        const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
        const int stepr = tx_size_high_unit[tx_size];
        const int stepc = tx_size_wide_unit[tx_size];
        const int step = stepr * stepc;
        const struct macroblockd_plane *const pd = &xd->plane[plane];
        const int unit_height = ROUND_POWER_OF_TWO(
            AOMMIN(mu_blocks_high + row, max_blocks_high), pd->subsampling_y);
        const int unit_width = ROUND_POWER_OF_TWO(
            AOMMIN(mu_blocks_wide + col, max_blocks_wide), pd->subsampling_x);
        for (int blk_row = row >> pd->subsampling_y; blk_row < unit_height;
             blk_row += stepr) {
          for (int blk_col = col >> pd->subsampling_x; blk_col < unit_width;
               blk_col += stepc) {
            av1_write_coeffs_txb(cm, x, w, blk_row, blk_col, plane,
                                 block[plane], tx_size);
            block[plane] += step;
          }
        }
      }
    }
  }
}